

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::vcd_T_trace<sc_dt::sc_bv_base>::write
          (vcd_T_trace<sc_dt::sc_bv_base> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  string sStack_58;
  string local_38;
  
  sc_dt::sc_proxy<sc_dt::sc_bv_base>::to_string_abi_cxx11_
            (&sStack_58,&this->object->super_sc_proxy<sc_dt::sc_bv_base>);
  vcd_trace::compose_line(&local_38,&this->super_vcd_trace,&sStack_58);
  fputs(local_38._M_dataplus._M_p,(FILE *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  sc_dt::assign_p_<sc_dt::sc_bv_base,sc_dt::sc_bv_base>
            (&(this->old_value).super_sc_proxy<sc_dt::sc_bv_base>,
             &this->object->super_sc_proxy<sc_dt::sc_bv_base>);
  return extraout_RAX;
}

Assistant:

void write( FILE* f )
    {
        std::fprintf( f, "%s", compose_line( object.to_string() ).c_str() );
        old_value = object;
    }